

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::ConsoleReporter::getDots_abi_cxx11_(void)

{
  int iVar1;
  
  if (getDots[abi:cxx11]()::dots_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getDots[abi:cxx11]()::dots_abi_cxx11_);
    if (iVar1 != 0) {
      getDots[abi:cxx11]()::dots_abi_cxx11_._M_dataplus._M_p =
           (pointer)&getDots[abi:cxx11]()::dots_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct(0x175450,'O');
      __cxa_atexit(std::__cxx11::string::~string,&getDots[abi:cxx11]()::dots_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getDots[abi:cxx11]()::dots_abi_cxx11_);
    }
  }
  return &getDots[abi:cxx11]()::dots_abi_cxx11_;
}

Assistant:

static std::string const& getDots() {
            static const std::string dots( CATCH_CONFIG_CONSOLE_WIDTH-1, '.' );
            return dots;
        }